

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

int GetMapIndex(char *mapname,int lastindex,char *lumpname,bool needrequired)

{
  int iVar1;
  uint uVar2;
  BYTE *__s1;
  checkstruct *__s2;
  ulong uVar3;
  uint uVar4;
  
  __s1 = "";
  if (lumpname != (char *)0x0) {
    __s1 = (BYTE *)lumpname;
  }
  uVar4 = lastindex + 1;
  uVar2 = 0xffffffff;
  if (uVar4 < 0xc) {
    uVar3 = (ulong)uVar4 - 1;
    __s2 = GetMapIndex::check + uVar4;
    while (iVar1 = strncasecmp((char *)__s1,__s2->lumpname,8), uVar2 = uVar4, iVar1 != 0) {
      if (__s2->required == true) {
        if (!needrequired) {
          return -2;
        }
        I_Error("\'%s\' not found in %s\n",__s2,mapname);
        return -2;
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 1;
      __s2 = __s2 + 1;
      if (10 < uVar3) {
        return -1;
      }
    }
  }
  return uVar2;
}

Assistant:

static int GetMapIndex(const char *mapname, int lastindex, const char *lumpname, bool needrequired)
{
	static const checkstruct check[] = 
	{
		{"",		 true},
		{"THINGS",	 true},
		{"LINEDEFS", true},
		{"SIDEDEFS", true},
		{"VERTEXES", true},
		{"SEGS",	 false},
		{"SSECTORS", false},
		{"NODES",	 false},
		{"SECTORS",	 true},
		{"REJECT",	 false},
		{"BLOCKMAP", false},
		{"BEHAVIOR", false},
		//{"SCRIPTS",	 false},
	};

	if (lumpname==NULL) lumpname="";

	for(size_t i=lastindex+1;i<countof(check);i++)
	{
		if (!strnicmp(lumpname, check[i].lumpname, 8))
			return (int)i;

		if (check[i].required)
		{
			if (needrequired)
			{
				I_Error("'%s' not found in %s\n", check[i].lumpname, mapname);
			}
			return -2;
		}
	}

	return -1;	// End of map reached
}